

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::detail::generic_type::dealloc
               (instance<void,_std::unique_ptr<void,_std::default_delete<void>_>_> *self)

{
  PyTypeObject *pPVar1;
  PyObject *op;
  _Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> it;
  internals *piVar2;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> __it;
  undefined8 *puVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  pVar4;
  
  if ((self->super_instance_essentials<void>).value != (void *)0x0) {
    pPVar1 = (self->super_instance_essentials<void>).ob_base.ob_type;
    piVar2 = get_internals();
    pVar4 = std::
            _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::equal_range(&(piVar2->registered_instances)._M_h,
                          &(self->super_instance_essentials<void>).value);
    __it._M_cur = (__node_type *)
                  pVar4.first.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>
                  ._M_cur;
    while( true ) {
      if (__it._M_cur ==
          (__node_type *)
          pVar4.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur
         ) {
        pybind11_fail("generic_type::dealloc(): Tried to deallocate unregistered instance!");
      }
      if (pPVar1 == *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) break;
      __it._M_cur = *__it._M_cur;
    }
    std::
    _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::erase(&(piVar2->registered_instances)._M_h,(const_iterator)__it._M_cur);
    if ((self->super_instance_essentials<void>).weakrefs != (PyObject *)0x0) {
      PyObject_ClearWeakRefs(self);
    }
    puVar3 = (undefined8 *)_PyObject_GetDictPtr(self);
    if ((puVar3 != (undefined8 *)0x0) && (op = (PyObject *)*puVar3, op != (PyObject *)0x0)) {
      *puVar3 = 0;
      _Py_DECREF(op);
    }
  }
  (*((self->super_instance_essentials<void>).ob_base.ob_type)->tp_free)(self);
  return;
}

Assistant:

static void dealloc(instance<void> *self) {
        if (self->value) {
            auto instance_type = Py_TYPE(self);
            auto &registered_instances = detail::get_internals().registered_instances;
            auto range = registered_instances.equal_range(self->value);
            bool found = false;
            for (auto it = range.first; it != range.second; ++it) {
                if (instance_type == Py_TYPE(it->second)) {
                    registered_instances.erase(it);
                    found = true;
                    break;
                }
            }
            if (!found)
                pybind11_fail("generic_type::dealloc(): Tried to deallocate unregistered instance!");

            if (self->weakrefs)
                PyObject_ClearWeakRefs((PyObject *) self);

            PyObject **dict_ptr = _PyObject_GetDictPtr((PyObject *) self);
            if (dict_ptr)
                Py_CLEAR(*dict_ptr);
        }
        Py_TYPE(self)->tp_free((PyObject*) self);
    }